

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VScaleVectorArray(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  N_Vector *X_00;
  N_Vector *Z;
  long lVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  timespec spec;
  realtype c [3];
  timespec local_60;
  int local_4c;
  realtype local_48 [3];
  
  X_00 = N_VCloneVectorArray(3,X);
  Z = N_VCloneVectorArray(3,X);
  N_VConst(0.5,*X_00);
  local_48[0] = 2.0;
  clock_gettime(4,&local_60);
  lVar4 = local_60.tv_sec - base_time_tv_sec;
  dVar7 = (double)local_60.tv_nsec;
  iVar6 = 1;
  iVar1 = N_VScaleVectorArray(1,local_48,X_00,X_00);
  sync_device();
  clock_gettime(4,&local_60);
  lVar5 = local_60.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_60.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,*X_00,param_2);
    if (iVar1 != 0) goto LAB_0010a23d;
    iVar6 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleVectorArray Case 1a ");
    }
  }
  else {
LAB_0010a23d:
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n",(ulong)(uint)myid);
  }
  max_time(X,(dVar8 / 1000000000.0 + (double)lVar5) - (dVar7 / 1000000000.0 + (double)lVar4));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleVectorArray");
  }
  N_VConst(0.5,*X_00);
  local_48[0] = 2.0;
  clock_gettime(4,&local_60);
  lVar4 = local_60.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_60.tv_nsec;
  iVar1 = N_VScaleVectorArray(1,local_48,X_00,Z);
  sync_device();
  clock_gettime(4,&local_60);
  lVar5 = local_60.tv_sec - base_time_tv_sec;
  dVar7 = (double)local_60.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,*Z,param_2);
    if (iVar1 != 0) goto LAB_0010a36f;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleVectorArray Case 1b ");
    }
  }
  else {
LAB_0010a36f:
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n",(ulong)(uint)myid);
    iVar6 = iVar6 + 1;
  }
  max_time(X,(dVar7 / 1000000000.0 + (double)lVar5) - (dVar8 / 1000000000.0 + (double)lVar4));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleVectorArray");
  }
  N_VConst(0.5,*X_00);
  N_VConst(-2.0,X_00[1]);
  N_VConst(-1.0,X_00[2]);
  local_48[0] = 2.0;
  local_48[1] = 0.5;
  local_48[2] = -2.0;
  clock_gettime(4,&local_60);
  lVar4 = local_60.tv_sec - base_time_tv_sec;
  dVar8 = (double)local_60.tv_nsec;
  iVar1 = N_VScaleVectorArray(3,local_48,X_00,X_00);
  sync_device();
  clock_gettime(4,&local_60);
  lVar5 = local_60.tv_sec - base_time_tv_sec;
  dVar7 = (double)local_60.tv_nsec;
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,*X_00,param_2);
    iVar2 = check_ans(-1.0,X_00[1],param_2);
    iVar3 = check_ans(2.0,X_00[2],param_2);
    if (iVar3 + iVar2 + iVar1 != 0) goto LAB_0010a527;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleVectorArray Case 2a ");
    }
  }
  else {
LAB_0010a527:
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n",(ulong)(uint)myid);
    iVar6 = iVar6 + 1;
  }
  max_time(X,(dVar7 / 1000000000.0 + (double)lVar5) - (dVar8 / 1000000000.0 + (double)lVar4));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleVectorArray");
  }
  N_VConst(0.5,*X_00);
  N_VConst(-2.0,X_00[1]);
  N_VConst(-1.0,X_00[2]);
  local_48[0] = 2.0;
  local_48[1] = 0.5;
  local_48[2] = -2.0;
  clock_gettime(4,&local_60);
  lVar4 = local_60.tv_sec - base_time_tv_sec;
  dVar7 = (double)local_60.tv_nsec;
  iVar1 = N_VScaleVectorArray(3,local_48,X_00,Z);
  sync_device();
  clock_gettime(4,&local_60);
  lVar5 = local_60.tv_sec - base_time_tv_sec;
  if (iVar1 == 0) {
    local_4c = iVar6;
    iVar1 = check_ans(1.0,*Z,param_2);
    iVar2 = check_ans(-1.0,Z[1],param_2);
    iVar6 = local_4c;
    iVar3 = check_ans(2.0,Z[2],param_2);
    if (iVar3 + iVar2 + iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VScaleVectorArray Case 2b ");
      }
      goto LAB_0010a6f9;
    }
  }
  printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n",(ulong)(uint)myid);
  iVar6 = iVar6 + 1;
LAB_0010a6f9:
  max_time(X,((double)local_60.tv_nsec / 1000000000.0 + (double)lVar5) -
             (dVar7 / 1000000000.0 + (double)lVar4));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleVectorArray");
  }
  N_VDestroyVectorArray(X_00,3);
  N_VDestroyVectorArray(Z,3);
  return iVar6;
}

Assistant:

int Test_N_VScaleVectorArray(N_Vector X, sunindextype local_length, int myid)
{
  int      fails = 0, failure = 0, ierr = 0;
  double   start_time, stop_time, maxt;

  realtype c[3];
  N_Vector *Y, *Z;

  /* create vectors for testing */
  Y = N_VCloneVectorArray(3, X);
  Z = N_VCloneVectorArray(3, X);

  /*
   * Case 1a: Y[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr = N_VScaleVectorArray(1, c, Y, Y);
  sync_device();
  stop_time = get_time();

  /* Y[0] should be a vector of +1 */
  if (ierr == 0)
    failure = check_ans(ONE, Y[0], local_length);
  else
    failure = 1;

  if (failure) {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 1b: Z[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr = N_VScaleVectorArray(1, c, Y, Z);
  sync_device();
  stop_time = get_time();

  /* Z[0] should be a vector of +1 */
  if (ierr == 0)
    failure = check_ans(ONE, Z[0], local_length);
  else
    failure = 1;

  if (failure) {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2a: Y[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF,    Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr = N_VScaleVectorArray(3, c, Y, Y);
  sync_device();
  stop_time = get_time();

  /* Y[i] should be a vector of +1, -1, 2 */
  if (ierr == 0) {
    failure  = check_ans(ONE,     Y[0], local_length);
    failure += check_ans(NEG_ONE, Y[1], local_length);
    failure += check_ans(TWO,     Y[2], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2b: Z[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF,    Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr = N_VScaleVectorArray(3, c, Y, Z);
  sync_device();
  stop_time = get_time();

  /* Z[i] should be a vector of +1, -1, 2 */
  if (ierr == 0) {
    failure  = check_ans(ONE,     Z[0], local_length);
    failure += check_ans(NEG_ONE, Z[1], local_length);
    failure += check_ans(TWO,     Z[2], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Y, 3);
  N_VDestroyVectorArray(Z, 3);

  return(fails);
}